

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder_graph.cc
# Opt level: O0

EdgePolyline * __thiscall
S2Builder::Graph::PolylineBuilder::BuildWalk
          (EdgePolyline *__return_storage_ptr__,PolylineBuilder *this,VertexId v)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  EdgeId *pEVar4;
  mapped_type *pmVar5;
  reference pvVar6;
  Edge *pEVar7;
  VertexInEdgeIds VVar8;
  reference rVar9;
  reference local_c8;
  reference local_b8;
  reference local_a8;
  int local_94;
  EdgeId *pEStack_90;
  EdgeId e_1;
  EdgeId *__end3;
  EdgeId *__begin3;
  EdgeId *local_78;
  VertexInEdgeIds *local_70;
  VertexInEdgeIds *__range3;
  int excess;
  _Bit_type local_58;
  int local_50;
  Iterator local_4c;
  EdgeId e;
  Iterator __end2;
  Iterator __begin2;
  VertexOutEdgeIds local_38;
  VertexOutEdgeIds *local_30;
  VertexOutEdgeIds *__range2;
  InputEdgeId best_out_id;
  EdgeId best_edge;
  PolylineBuilder *pPStack_18;
  VertexId v_local;
  PolylineBuilder *this_local;
  EdgePolyline *polyline;
  
  best_out_id._3_1_ = 0;
  best_edge = v;
  pPStack_18 = this;
  this_local = (PolylineBuilder *)__return_storage_ptr__;
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__);
  do {
    __range2._4_4_ = -1;
    __range2._0_4_ = std::numeric_limits<int>::max();
    local_38 = VertexOutMap::edge_ids(&this->out_,best_edge);
    local_30 = &local_38;
    e = (EdgeId)VertexOutEdgeIds::begin(local_30);
    local_4c = VertexOutEdgeIds::end(local_30);
    while( true ) {
      bVar1 = VertexOutEdgeIds::Iterator::operator!=((Iterator *)&e,&local_4c);
      if (!bVar1) break;
      pEVar4 = VertexOutEdgeIds::Iterator::operator*((Iterator *)&e);
      local_50 = *pEVar4;
      rVar9 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->used_,(long)local_50);
      _excess = rVar9;
      bVar2 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&excess);
      bVar1 = true;
      if (!bVar2) {
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&this->min_input_ids_,(long)local_50);
        bVar1 = (int)__range2 <= *pvVar6;
      }
      if (!bVar1) {
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&this->min_input_ids_,(long)local_50);
        __range2._0_4_ = *pvVar6;
        __range2._4_4_ = local_50;
      }
      VertexOutEdgeIds::Iterator::operator++((Iterator *)&e);
    }
    if (__range2._4_4_ < 0) {
      return __return_storage_ptr__;
    }
    iVar3 = excess_degree(this,best_edge);
    pmVar5 = gtl::internal_btree::
             btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
             ::operator[](&(this->excess_used_).
                           super_btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                          ,&best_edge);
    __range3._0_4_ = iVar3 - *pmVar5;
    if ((this->directed_ & 1U) == 0) {
      if ((int)__range3 % 2 == 1) goto LAB_0041101e;
    }
    else if ((int)__range3 < 0) {
LAB_0041101e:
      VVar8 = VertexInMap::edge_ids(&this->in_,best_edge);
      local_78 = VVar8.end_;
      __begin3 = VVar8.begin_;
      local_70 = (VertexInEdgeIds *)&__begin3;
      __end3 = VertexInEdgeIds::begin(local_70);
      pEStack_90 = VertexInEdgeIds::end(local_70);
      for (; __end3 != pEStack_90; __end3 = __end3 + 1) {
        local_94 = *__end3;
        rVar9 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->used_,(long)local_94);
        local_a8 = rVar9;
        bVar2 = std::_Bit_reference::operator_cast_to_bool(&local_a8);
        bVar1 = false;
        if (!bVar2) {
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&this->min_input_ids_,(long)local_94);
          bVar1 = *pvVar6 <= (int)__range2;
        }
        if (bVar1) {
          return __return_storage_ptr__;
        }
      }
    }
    std::vector<int,_std::allocator<int>_>::push_back
              (__return_storage_ptr__,(value_type_conflict1 *)((long)&__range2 + 4));
    rVar9 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->used_,(long)__range2._4_4_);
    local_b8 = rVar9;
    std::_Bit_reference::operator=(&local_b8,true);
    if ((this->directed_ & 1U) == 0) {
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&this->sibling_map_,(long)__range2._4_4_);
      rVar9 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->used_,(long)*pvVar6);
      local_c8 = rVar9;
      std::_Bit_reference::operator=(&local_c8,true);
    }
    this->edges_left_ = this->edges_left_ + -1;
    pEVar7 = Graph::edge(this->g_,__range2._4_4_);
    best_edge = pEVar7->second;
  } while( true );
}

Assistant:

Graph::EdgePolyline Graph::PolylineBuilder::BuildWalk(VertexId v) {
  EdgePolyline polyline;
  for (;;) {
    // Follow the edge with the smallest input edge id.
    EdgeId best_edge = -1;
    InputEdgeId best_out_id = std::numeric_limits<InputEdgeId>::max();
    for (EdgeId e : out_.edge_ids(v)) {
      if (used_[e] || min_input_ids_[e] >= best_out_id) continue;
      best_out_id = min_input_ids_[e];
      best_edge = e;
    }
    if (best_edge < 0) return polyline;
    // For idempotency when there are multiple input polylines, we stop the
    // walk early if "best_edge" might be a continuation of a different
    // incoming edge.
    int excess = excess_degree(v) - excess_used_[v];
    if (directed_ ? (excess < 0) : (excess % 2) == 1) {
      for (EdgeId e : in_.edge_ids(v)) {
        if (!used_[e] && min_input_ids_[e] <= best_out_id) {
          return polyline;
        }
      }
    }
    polyline.push_back(best_edge);
    used_[best_edge] = true;
    if (!directed_) used_[sibling_map_[best_edge]] = true;
    --edges_left_;
    v = g_.edge(best_edge).second;
  }
}